

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::emitScopeEnd
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Expression *curr)

{
  Try *pTVar1;
  Expression **expr;
  If *pIVar2;
  Expression *local_18;
  
  local_18 = curr;
  switch(this[4].func[-1].funcLocation.end) {
  case 0:
    handle_unreachable("unexpected end of function",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                       ,0x12f);
  case 1:
    expr = &local_18;
    break;
  case 2:
    pIVar2 = (If *)Expression::cast<wasm::Loop>(curr);
    goto LAB_00af57e9;
  case 3:
    pIVar2 = Expression::cast<wasm::If>(curr);
    expr = &pIVar2->ifTrue;
    break;
  case 4:
    pIVar2 = Expression::cast<wasm::If>(curr);
LAB_00af57e9:
    expr = &pIVar2->ifFalse;
    break;
  case 5:
    handle_unreachable("try without catch",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                       ,0x12d);
  case 6:
    pTVar1 = Expression::cast<wasm::Try>(curr);
    expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                     (&(pTVar1->catchBodies).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    break;
  default:
    goto switchD_00af57b6_default;
  }
  anon_unknown_18::Poppifier::patchScope((Poppifier *)this,expr);
switchD_00af57b6_default:
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &this[4].func[-1].effects,&local_18);
  return;
}

Assistant:

void emitScopeEnd(Expression* curr) {
    static_cast<SubType*>(this)->emitScopeEnd(curr);
  }